

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O0

string_type * __thiscall
srell::
match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::str(string_type *__return_storage_ptr__,
     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
     *this,size_type sub)

{
  const_reference this_00;
  size_type sub_local;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_local;
  
  this_00 = operator[](this,sub);
  sub_match::operator_cast_to_string(__return_storage_ptr__,(sub_match *)this_00);
  return __return_storage_ptr__;
}

Assistant:

string_type str(const size_type sub = 0) const
	{
		return string_type((*this)[sub]);
	}